

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archive_manifest.cpp
# Opt level: O0

ON_ComponentManifestItem * __thiscall
ON_ComponentManifest::ItemFromIndex
          (ON_ComponentManifest *this,Type component_type,int manifest_item_index)

{
  ON_ComponentManifestItem_PRIVATE *local_38;
  ON_ComponentManifestItem_PRIVATE *local_30;
  ON_ComponentManifestItem_PRIVATE *item;
  int manifest_item_index_local;
  Type component_type_local;
  ON_ComponentManifest *this_local;
  
  if (this->m_impl == (ON_ComponentManifestImpl *)0x0) {
    local_30 = (ON_ComponentManifestItem_PRIVATE *)0x0;
  }
  else {
    local_30 = ON_ComponentManifestImpl::ItemFromManifestIndex
                         (this->m_impl,component_type,manifest_item_index);
  }
  if (local_30 == (ON_ComponentManifestItem_PRIVATE *)0x0) {
    local_38 = (ON_ComponentManifestItem_PRIVATE *)&ON_ComponentManifestItem::UnsetItem;
  }
  else {
    local_38 = local_30;
  }
  return &local_38->super_ON_ComponentManifestItem;
}

Assistant:

const class ON_ComponentManifestItem& ON_ComponentManifest::ItemFromIndex(
  ON_ModelComponent::Type component_type,
  int manifest_item_index
  ) const
{
  const ON_ComponentManifestItem_PRIVATE* item
    = (nullptr != m_impl)
    ? m_impl->ItemFromManifestIndex(component_type,manifest_item_index)
    : nullptr;
  return
    (nullptr != item )
    ? *item
    : ON_ComponentManifestItem::UnsetItem;
}